

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O0

optional<long>
wallet::MaxInputWeight
          (Descriptor *desc,optional<CTxIn> *txin,CCoinControl *coin_control,bool tx_is_segwit,
          bool can_grind_r)

{
  long lVar1;
  bool bVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  long *in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  optional<long> oVar4;
  int64_t witstack_len;
  int64_t scriptsig_len;
  bool is_segwit;
  optional<long> elems_count;
  optional<long> sat_weight;
  optional<long> *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  optional<long> *in_stack_ffffffffffffff68;
  CCoinControl *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  bool local_71;
  _Storage<long,_true> local_18;
  undefined1 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_71 = true;
  if ((in_R8B & 1) != 0) {
    local_71 = UseMaxSig((optional<CTxIn> *)
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                         in_stack_ffffffffffffff70);
  }
  (**(code **)(*in_RDI + 0x68))(in_RDI,local_71);
  bVar2 = std::optional::operator_cast_to_bool(in_stack_ffffffffffffff58);
  if (bVar2) {
    (**(code **)(*in_RDI + 0x70))();
    bVar2 = std::optional::operator_cast_to_bool(in_stack_ffffffffffffff58);
    if (bVar2) {
      bVar2 = IsSegwit((Descriptor *)in_stack_ffffffffffffff58);
      if (bVar2) {
        std::optional<long>::operator*(in_stack_ffffffffffffff58);
        GetSizeOfCompactSize((uint64_t)in_stack_ffffffffffffff70);
      }
      else {
        std::optional<long>::operator*(in_stack_ffffffffffffff58);
        GetSizeOfCompactSize((uint64_t)in_stack_ffffffffffffff70);
      }
      std::optional<long>::operator*(in_stack_ffffffffffffff58);
      std::optional<long>::optional<long,_true>
                (in_stack_ffffffffffffff68,
                 (long *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      uVar3 = extraout_RDX;
      goto LAB_016c111e;
    }
  }
  std::optional<long>::optional(in_stack_ffffffffffffff58);
  uVar3 = extraout_RDX_00;
LAB_016c111e:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_
         = (undefined7)((ulong)uVar3 >> 8);
    oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_engaged = (bool)local_10;
    oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = local_18._M_value;
    return (optional<long>)
           oVar4.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

static std::optional<int64_t> MaxInputWeight(const Descriptor& desc, const std::optional<CTxIn>& txin,
                                             const CCoinControl* coin_control, const bool tx_is_segwit,
                                             const bool can_grind_r) {
    if (const auto sat_weight = desc.MaxSatisfactionWeight(!can_grind_r || UseMaxSig(txin, coin_control))) {
        if (const auto elems_count = desc.MaxSatisfactionElems()) {
            const bool is_segwit = IsSegwit(desc);
            // Account for the size of the scriptsig and the number of elements on the witness stack. Note
            // that if any input in the transaction is spending a witness program, we need to specify the
            // witness stack size for every input regardless of whether it is segwit itself.
            // NOTE: this also works in case of mixed scriptsig-and-witness such as in p2sh-wrapped segwit v0
            // outputs. In this case the size of the scriptsig length will always be one (since the redeemScript
            // is always a push of the witness program in this case, which is smaller than 253 bytes).
            const int64_t scriptsig_len = is_segwit ? 1 : GetSizeOfCompactSize(*sat_weight / WITNESS_SCALE_FACTOR);
            const int64_t witstack_len = is_segwit ? GetSizeOfCompactSize(*elems_count) : (tx_is_segwit ? 1 : 0);
            // previous txid + previous vout + sequence + scriptsig len + witstack size + scriptsig or witness
            // NOTE: sat_weight already accounts for the witness discount accordingly.
            return (32 + 4 + 4 + scriptsig_len) * WITNESS_SCALE_FACTOR + witstack_len + *sat_weight;
        }
    }

    return {};
}